

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5IndexFlush(Fts5Index *p)

{
  long in_RDI;
  Fts5Hash *in_stack_00000010;
  Fts5Index *in_stack_00000070;
  
  if (*(int *)(in_RDI + 0x40) == 0) {
    if ((*(int *)(in_RDI + 0x20) != 0) || (*(int *)(in_RDI + 0x34) != 0)) {
      fts5FlushOneHash(in_stack_00000070);
      if (*(int *)(in_RDI + 0x3c) == 0) {
        sqlite3Fts5HashClear(in_stack_00000010);
        *(undefined4 *)(in_RDI + 0x20) = 0;
        *(undefined4 *)(in_RDI + 0x38) = 0;
        *(undefined4 *)(in_RDI + 0x34) = 0;
      }
      else if ((*(int *)(in_RDI + 0x20) != 0) || (*(int *)(in_RDI + 0x34) != 0)) {
        *(undefined4 *)(in_RDI + 0x40) = *(undefined4 *)(in_RDI + 0x3c);
      }
    }
  }
  else {
    *(undefined4 *)(in_RDI + 0x3c) = *(undefined4 *)(in_RDI + 0x40);
  }
  return;
}

Assistant:

static void fts5IndexFlush(Fts5Index *p){
  /* Unless it is empty, flush the hash table to disk */
  if( p->flushRc ){
    p->rc = p->flushRc;
    return;
  }
  if( p->nPendingData || p->nContentlessDelete ){
    assert( p->pHash );
    fts5FlushOneHash(p);
    if( p->rc==SQLITE_OK ){
      sqlite3Fts5HashClear(p->pHash);
      p->nPendingData = 0;
      p->nPendingRow = 0;
      p->nContentlessDelete = 0;
    }else if( p->nPendingData || p->nContentlessDelete ){
      p->flushRc = p->rc;
    }
  }
}